

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *buf_ptr;
  ptrdiff_t _Num;
  ulong uVar8;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_01;
  format_int local_58;
  
  pcVar6 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar5 = strlen(pcVar6);
  uVar8 = (dest->super_buffer<char>).size_ + sVar5;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8);
  }
  if (sVar5 != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,sVar5);
  }
  (dest->super_buffer<char>).size_ = uVar8;
  if ((dest->super_buffer<char>).capacity_ < uVar8 + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8 + 1);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  pcVar6 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar5 = strlen(pcVar6);
  uVar8 = (dest->super_buffer<char>).size_ + sVar5;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8);
  }
  if (sVar5 != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar6,sVar5);
  }
  (dest->super_buffer<char>).size_ = uVar8;
  if ((dest->super_buffer<char>).capacity_ < uVar8 + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8 + 1);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  pcVar6 = fmt::v6::format_int::format_decimal(&local_58,(ulong)uVar4);
  local_58.str_ = pcVar6;
  if ((int)uVar1 < 0) {
    local_58.str_ = pcVar6 + -1;
    pcVar6[-1] = '-';
  }
  pcVar7 = local_58.str_;
  pcVar6 = local_58.buffer_ + 0x15;
  sVar5 = (long)pcVar6 - (long)local_58.str_;
  uVar8 = (dest->super_buffer<char>).size_ + sVar5;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8);
  }
  if (pcVar6 != pcVar7) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar5);
  }
  (dest->super_buffer<char>).size_ = uVar8;
  if ((dest->super_buffer<char>).capacity_ < uVar8 + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8 + 1);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  uVar1 = tm_time->tm_hour;
  uVar8 = (ulong)uVar1;
  if (uVar8 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (byte)(uVar8 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    format_str.size_ = 5;
    format_str.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)&local_58;
    args.types_ = 2;
    local_58.buffer_._0_8_ = uVar8;
    fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)dest,format_str,args,(locale_ref)0x0);
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ':';
  uVar1 = tm_time->tm_min;
  uVar8 = (ulong)uVar1;
  if (uVar8 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (byte)(uVar8 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    format_str_00.size_ = 5;
    format_str_00.data_ = "{:02}";
    args_00.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)&local_58;
    args_00.types_ = 2;
    local_58.buffer_._0_8_ = uVar8;
    fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)dest,format_str_00,args_00,(locale_ref)0x0);
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ':';
  uVar1 = tm_time->tm_sec;
  uVar8 = (ulong)uVar1;
  if (uVar8 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (byte)(uVar8 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar3 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar3 + 1;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    format_str_01.size_ = 5;
    format_str_01.data_ = "{:02}";
    args_01.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)&local_58;
    args_01.types_ = 2;
    local_58.buffer_._0_8_ = uVar8;
    fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)dest,format_str_01,args_01,(locale_ref)0x0);
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar3 + 1;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  pcVar7 = fmt::v6::format_int::format_decimal(&local_58,(ulong)uVar4);
  local_58.str_ = pcVar7;
  if (iVar2 < -0x76c) {
    local_58.str_ = pcVar7 + -1;
    pcVar7[-1] = '-';
  }
  pcVar7 = local_58.str_;
  sVar5 = (long)pcVar6 - (long)local_58.str_;
  uVar8 = (dest->super_buffer<char>).size_ + sVar5;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar8);
  }
  if (pcVar6 != pcVar7) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar5);
  }
  (dest->super_buffer<char>).size_ = uVar8;
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }